

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YSet.cpp
# Opt level: O3

YError __thiscall
Yedis::YSet::sadd(YSet *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *params,ReplyBuffer *reply)

{
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  YObject *pYVar2;
  ulong uVar3;
  pointer pbVar4;
  __hashtable *__h;
  long lVar5;
  uint uVar6;
  YError YVar7;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_40;
  ReplyBuffer *local_38;
  
  pYVar2 = creatrOrGetSet(this,(params->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,reply);
  if (pYVar2 == (YObject *)0x0) {
    ReplyBuffer::pushData(reply,"-ERR error type\r\n",0xf);
    YVar7 = YError_type;
  }
  else {
    pbVar4 = (params->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(params->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x41) {
      uVar3 = 0;
    }
    else {
      p_Var1 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)pYVar2->value;
      uVar3 = 2;
      uVar6 = 0;
      lVar5 = 0x40;
      local_38 = reply;
      do {
        local_40 = p_Var1;
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                          (p_Var1,(long)&(pbVar4->_M_dataplus)._M_p + lVar5,&local_40);
        uVar6 = uVar6 + (pVar8.second & 1);
        uVar3 = uVar3 + 1;
        pbVar4 = (params->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x20;
      } while (uVar3 < (ulong)((long)(params->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
      uVar3 = (ulong)uVar6;
      reply = local_38;
    }
    YVar7 = YError_ok;
    YedisFormate::formatInt(uVar3,reply);
  }
  return YVar7;
}

Assistant:

YError YSet::sadd(const std::vector<std::string>& params, ReplyBuffer* reply)
{
    YObject* value = creatrOrGetSet(params[1], reply);
    if(value == nullptr)
    {
        reply->pushData("-ERR error type\r\n", sizeof("-ERR error type") -1);
        return YError_type;
    }
    int res = 0;
    auto set = value->castSet();
    for (std::size_t i = 2; i < params.size(); ++ i)
    {
        if (set->insert(params[i]).second)
        {
            ++res;
        }
    }
    
    Yedis::YedisFormate::formatInt(res, reply);
    return YError_ok;
}